

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O2

void __thiscall CGL::DrawRend::move_view(DrawRend *this,float dx,float dy,float zoom)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix3x3 *this_00;
  double dVar4;
  
  this_00 = (this->svg_to_ndc).super__Vector_base<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>.
            _M_impl.super__Vector_impl_data._M_start + this->current_svg;
  pdVar3 = Matrix3x3::operator()(this_00,2,2);
  dVar1 = *pdVar3;
  dVar4 = (double)(float)(dVar1 * 0.5);
  pdVar3 = Matrix3x3::operator()(this_00,0,2);
  dVar2 = *pdVar3;
  pdVar3 = Matrix3x3::operator()(this_00,1,2);
  set_view(this,(float)(dVar4 - dVar2) - dx,(float)(dVar4 - *pdVar3) - dy,
           zoom * (float)(dVar1 * 0.5));
  return;
}

Assistant:

void DrawRend::move_view(float dx, float dy, float zoom) {
  Matrix3x3& m = svg_to_ndc[current_svg];
  float span = m(2,2)/2.;
  float x = span - m(0,2), y = span - m(1,2);
  set_view(x - dx, y - dy, span * zoom);
}